

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::ShapeAtomTypesSectionParser::parseShapeFile
          (ShapeAtomTypesSectionParser *this,ForceField *param_1,string *shapeFileName,AtomType *at)

{
  RealType RVar1;
  RealSphericalHarmonic *pRVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  RealSphericalHarmonic *pRVar6;
  SimpleTypeData<OpenMD::ShapeAtomType_*> *__p;
  char *__end;
  RealSphericalHarmonic *rsh;
  DirectionalAdapter da;
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  functionVector;
  StringTokenizer tokenInfo;
  string tempString;
  string token;
  string ffPath;
  ifstrstream shapeStream;
  char buffer [65535];
  RealSphericalHarmonic *pRStack_10490;
  undefined1 auStack_10488 [32];
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  vStack_10468;
  string *psStack_10450;
  string sStack_10448;
  ShapeAtomType *pSStack_10428;
  StringTokenizer SStack_10420;
  AtomType *pAStack_103c8;
  undefined1 *puStack_103c0;
  undefined8 uStack_103b8;
  undefined1 uStack_103b0;
  undefined7 uStack_103af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_103a0;
  _Rb_tree_node_base *p_Stack_10380;
  undefined8 uStack_10378;
  _Rb_tree_node_base _Stack_10370;
  shared_ptr<OpenMD::GenericData> sStack_10350;
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  vStack_10340;
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  vStack_10328;
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  vStack_10310;
  Mat3x3d MStack_102f8;
  undefined1 auStack_102b0 [632];
  byte abStack_10038 [65544];
  
  bStack_103a0._M_dataplus._M_p = (pointer)((long)&bStack_103a0 + 0x10);
  bStack_103a0._M_string_length = 0;
  bStack_103a0.field_2._M_local_buf[0] = '\0';
  vStack_10468.
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (RealSphericalHarmonic **)0x0;
  vStack_10468.
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (RealSphericalHarmonic **)0x0;
  vStack_10468.
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (RealSphericalHarmonic **)0x0;
  psStack_10450 = shapeFileName;
  pAStack_103c8 = at;
  ifstrstream::ifstrstream((ifstrstream *)auStack_102b0);
  puStack_103c0 = &uStack_103b0;
  uStack_103b8 = 0;
  uStack_103b0 = 0;
  p_Stack_10380 = &_Stack_10370;
  uStack_10378 = 0;
  _Stack_10370._M_color._0_1_ = _S_red;
  __s = getenv("FORCE_PARAM_PATH");
  if (__s == (char *)0x0) {
    __s = "/usr/local/openmd/forceFields";
  }
  else {
    strlen(__s);
  }
  std::__cxx11::string::_M_replace((ulong)&p_Stack_10380,0,(char *)0x0,(ulong)__s);
  ifstrstream::open((ifstrstream *)auStack_102b0,(psStack_10450->_M_dataplus)._M_p,8,0);
  bVar3 = ifstrstream::is_open((ifstrstream *)auStack_102b0);
  if (!bVar3) {
    std::__cxx11::string::_M_assign((string *)&puStack_103c0);
    std::__cxx11::string::append((char *)&puStack_103c0);
    std::__cxx11::string::_M_append((char *)&puStack_103c0,(ulong)(psStack_10450->_M_dataplus)._M_p)
    ;
    std::__cxx11::string::_M_assign((string *)psStack_10450);
    ifstrstream::open((ifstrstream *)auStack_102b0,(psStack_10450->_M_dataplus)._M_p,8,0);
    bVar3 = ifstrstream::is_open((ifstrstream *)auStack_102b0);
    if (!bVar3) {
      snprintf(painCave.errMsg,2000,
               "Error opening the shape file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
               ,(psStack_10450->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  pSStack_10428 = (ShapeAtomType *)operator_new(0x48);
  (pSStack_10428->strengthFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSStack_10428->strengthFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSStack_10428->rangeFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSStack_10428->rangeFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSStack_10428->contactFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSStack_10428->rangeFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSStack_10428->contactFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSStack_10428->contactFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSStack_10428->strengthFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  findBegin((istream *)auStack_102b0,"ShapeInfo");
  std::ios::widen((char)(istream *)auStack_102b0 +
                  (char)*(_func_int **)(auStack_102b0._0_8_ + -0x18));
  std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  while (((byte)(*(_func_int **)(auStack_102b0._0_8_ + -0x18))[(long)(auStack_102b0 + 0x20)] & 2) ==
         0) {
    if ((abStack_10038[0] & 0xfd) != 0x21) {
      iVar4 = isEndLine((char *)abStack_10038);
      if (iVar4 != 0) break;
      auStack_10488._0_8_ = auStack_10488 + 0x10;
      sVar5 = strlen((char *)abStack_10038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_10488,abStack_10038,abStack_10038 + sVar5);
      sStack_10448._M_dataplus._M_p = (pointer)&sStack_10448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10448," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&SStack_10420,(string *)auStack_10488,&sStack_10448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_10448._M_dataplus._M_p != &sStack_10448.field_2) {
        operator_delete(sStack_10448._M_dataplus._M_p,sStack_10448.field_2._M_allocated_capacity + 1
                       );
      }
      if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
        operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
      }
      iVar4 = StringTokenizer::countTokens(&SStack_10420);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&SStack_10420);
        if (iVar4 < 5) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a ShapeInfo line in file: %s\n"
                   ,(psStack_10450->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          StringTokenizer::skipToken(&SStack_10420);
          RVar1 = StringTokenizer::nextTokenAsDouble(&SStack_10420);
          AtomType::setMass(pAStack_103c8,RVar1);
          auStack_10488._0_8_ = pAStack_103c8;
          _Stack_10370._M_right = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&SStack_10420);
          _Stack_10370._M_left = (_Base_ptr)StringTokenizer::nextTokenAsDouble(&SStack_10420);
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
               StringTokenizer::nextTokenAsDouble(&SStack_10420);
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               (double)_Stack_10370._M_right;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
               0.0;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
               0.0;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
               0.0;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
               (double)_Stack_10370._M_left;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
               0.0;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
               0.0;
          MStack_102f8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
               0.0;
          DirectionalAdapter::makeDirectional((DirectionalAdapter *)auStack_10488,&MStack_102f8);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.delim_._M_dataplus._M_p != &SStack_10420.delim_.field_2) {
        operator_delete(SStack_10420.delim_._M_dataplus._M_p,
                        SStack_10420.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.tokenString_._M_dataplus._M_p != &SStack_10420.tokenString_.field_2) {
        operator_delete(SStack_10420.tokenString_._M_dataplus._M_p,
                        SStack_10420.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
    std::ios::widen((char)*(_func_int **)(auStack_102b0._0_8_ + -0x18) + (char)auStack_102b0);
    std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  }
  findBegin((istream *)auStack_102b0,"ContactFunctions");
  if (vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    vStack_10468.
    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_10468.
         super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::ios::widen((char)(istream *)auStack_102b0 +
                  (char)*(_func_int **)(auStack_102b0._0_8_ + -0x18));
  std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  while (((byte)(*(_func_int **)(auStack_102b0._0_8_ + -0x18))[(long)(auStack_102b0 + 0x20)] & 2) ==
         0) {
    if ((abStack_10038[0] & 0xfd) != 0x21) {
      iVar4 = isEndLine((char *)abStack_10038);
      if (iVar4 != 0) break;
      auStack_10488._0_8_ = auStack_10488 + 0x10;
      sVar5 = strlen((char *)abStack_10038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_10488,abStack_10038,abStack_10038 + sVar5);
      sStack_10448._M_dataplus._M_p = (pointer)&sStack_10448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10448," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&SStack_10420,(string *)auStack_10488,&sStack_10448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_10448._M_dataplus._M_p != &sStack_10448.field_2) {
        operator_delete(sStack_10448._M_dataplus._M_p,sStack_10448.field_2._M_allocated_capacity + 1
                       );
      }
      if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
        operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
      }
      iVar4 = StringTokenizer::countTokens(&SStack_10420);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&SStack_10420);
        if (iVar4 < 4) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a ContactFunctions line in file: %s\n"
                   ,(psStack_10450->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          pRVar6 = (RealSphericalHarmonic *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic(pRVar6);
          pRStack_10490 = pRVar6;
          iVar4 = StringTokenizer::nextTokenAsInt(&SStack_10420);
          pRVar2 = pRStack_10490;
          pRVar6->L = iVar4;
          iVar4 = StringTokenizer::nextTokenAsInt(&SStack_10420);
          pRVar2->M = iVar4;
          StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10488,&SStack_10420);
          std::__cxx11::string::operator=((string *)&bStack_103a0,(string *)auStack_10488);
          if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
            operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
          }
          std::locale::locale((locale *)auStack_10488);
          toLower<std::__cxx11::string>(&bStack_103a0,(locale *)auStack_10488);
          std::locale::~locale((locale *)auStack_10488);
          iVar4 = std::__cxx11::string::compare((char *)&bStack_103a0);
          pRVar2 = pRStack_10490;
          pRStack_10490->functionType = (ushort)(iVar4 != 0);
          RVar1 = StringTokenizer::nextTokenAsDouble(&SStack_10420);
          pRVar2->coefficient = RVar1;
          if (vStack_10468.
              super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_10468.
              super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<OpenMD::RealSphericalHarmonic*,std::allocator<OpenMD::RealSphericalHarmonic*>>::
            _M_realloc_insert<OpenMD::RealSphericalHarmonic*const&>
                      ((vector<OpenMD::RealSphericalHarmonic*,std::allocator<OpenMD::RealSphericalHarmonic*>>
                        *)&vStack_10468,
                       (iterator)
                       vStack_10468.
                       super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&pRStack_10490);
          }
          else {
            *vStack_10468.
             super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = pRStack_10490;
            vStack_10468.
            super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_10468.
                 super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.delim_._M_dataplus._M_p != &SStack_10420.delim_.field_2) {
        operator_delete(SStack_10420.delim_._M_dataplus._M_p,
                        SStack_10420.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.tokenString_._M_dataplus._M_p != &SStack_10420.tokenString_.field_2) {
        operator_delete(SStack_10420.tokenString_._M_dataplus._M_p,
                        SStack_10420.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
    std::ios::widen((char)*(_func_int **)(auStack_102b0._0_8_ + -0x18) + (char)auStack_102b0);
    std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector(&vStack_10310,&vStack_10468);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  operator=(&pSStack_10428->contactFuncs,&vStack_10310);
  if (vStack_10310.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_10310.
                    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_10310.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10310.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  findBegin((istream *)auStack_102b0,"RangeFunctions");
  if (vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    vStack_10468.
    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_10468.
         super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::ios::widen((char)(istream *)auStack_102b0 +
                  (char)*(_func_int **)(auStack_102b0._0_8_ + -0x18));
  std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  while (((byte)(*(_func_int **)(auStack_102b0._0_8_ + -0x18))[(long)(auStack_102b0 + 0x20)] & 2) ==
         0) {
    if ((abStack_10038[0] & 0xfd) != 0x21) {
      iVar4 = isEndLine((char *)abStack_10038);
      if (iVar4 != 0) break;
      auStack_10488._0_8_ = auStack_10488 + 0x10;
      sVar5 = strlen((char *)abStack_10038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_10488,abStack_10038,abStack_10038 + sVar5);
      sStack_10448._M_dataplus._M_p = (pointer)&sStack_10448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10448," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&SStack_10420,(string *)auStack_10488,&sStack_10448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_10448._M_dataplus._M_p != &sStack_10448.field_2) {
        operator_delete(sStack_10448._M_dataplus._M_p,sStack_10448.field_2._M_allocated_capacity + 1
                       );
      }
      if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
        operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
      }
      iVar4 = StringTokenizer::countTokens(&SStack_10420);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&SStack_10420);
        if (iVar4 < 4) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a RangeFunctions line in file: %s\n"
                   ,(psStack_10450->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          pRVar6 = (RealSphericalHarmonic *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic(pRVar6);
          pRStack_10490 = pRVar6;
          iVar4 = StringTokenizer::nextTokenAsInt(&SStack_10420);
          pRVar2 = pRStack_10490;
          pRVar6->L = iVar4;
          iVar4 = StringTokenizer::nextTokenAsInt(&SStack_10420);
          pRVar2->M = iVar4;
          StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10488,&SStack_10420);
          std::__cxx11::string::operator=((string *)&bStack_103a0,(string *)auStack_10488);
          if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
            operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
          }
          std::locale::locale((locale *)auStack_10488);
          toLower<std::__cxx11::string>(&bStack_103a0,(locale *)auStack_10488);
          std::locale::~locale((locale *)auStack_10488);
          iVar4 = std::__cxx11::string::compare((char *)&bStack_103a0);
          pRVar2 = pRStack_10490;
          pRStack_10490->functionType = (ushort)(iVar4 != 0);
          RVar1 = StringTokenizer::nextTokenAsDouble(&SStack_10420);
          pRVar2->coefficient = RVar1;
          if (vStack_10468.
              super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_10468.
              super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<OpenMD::RealSphericalHarmonic*,std::allocator<OpenMD::RealSphericalHarmonic*>>::
            _M_realloc_insert<OpenMD::RealSphericalHarmonic*const&>
                      ((vector<OpenMD::RealSphericalHarmonic*,std::allocator<OpenMD::RealSphericalHarmonic*>>
                        *)&vStack_10468,
                       (iterator)
                       vStack_10468.
                       super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&pRStack_10490);
          }
          else {
            *vStack_10468.
             super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = pRStack_10490;
            vStack_10468.
            super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_10468.
                 super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.delim_._M_dataplus._M_p != &SStack_10420.delim_.field_2) {
        operator_delete(SStack_10420.delim_._M_dataplus._M_p,
                        SStack_10420.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.tokenString_._M_dataplus._M_p != &SStack_10420.tokenString_.field_2) {
        operator_delete(SStack_10420.tokenString_._M_dataplus._M_p,
                        SStack_10420.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
    std::ios::widen((char)*(_func_int **)(auStack_102b0._0_8_ + -0x18) + (char)auStack_102b0);
    std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector(&vStack_10328,&vStack_10468);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  operator=(&pSStack_10428->rangeFuncs,&vStack_10328);
  if (vStack_10328.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_10328.
                    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_10328.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10328.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  findBegin((istream *)auStack_102b0,"StrengthFunctions");
  if (vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    vStack_10468.
    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_10468.
         super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::ios::widen((char)(istream *)auStack_102b0 +
                  (char)*(_func_int **)(auStack_102b0._0_8_ + -0x18));
  std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  while (((byte)(*(_func_int **)(auStack_102b0._0_8_ + -0x18))[(long)(auStack_102b0 + 0x20)] & 2) ==
         0) {
    if ((abStack_10038[0] & 0xfd) != 0x21) {
      iVar4 = isEndLine((char *)abStack_10038);
      if (iVar4 != 0) break;
      auStack_10488._0_8_ = auStack_10488 + 0x10;
      sVar5 = strlen((char *)abStack_10038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_10488,abStack_10038,abStack_10038 + sVar5);
      sStack_10448._M_dataplus._M_p = (pointer)&sStack_10448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10448," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&SStack_10420,(string *)auStack_10488,&sStack_10448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_10448._M_dataplus._M_p != &sStack_10448.field_2) {
        operator_delete(sStack_10448._M_dataplus._M_p,sStack_10448.field_2._M_allocated_capacity + 1
                       );
      }
      if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
        operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
      }
      iVar4 = StringTokenizer::countTokens(&SStack_10420);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&SStack_10420);
        if (iVar4 < 4) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a StrengthFunctions line in file: %s\n"
                   ,(psStack_10450->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          pRVar6 = (RealSphericalHarmonic *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic(pRVar6);
          pRStack_10490 = pRVar6;
          iVar4 = StringTokenizer::nextTokenAsInt(&SStack_10420);
          pRVar2 = pRStack_10490;
          pRVar6->L = iVar4;
          iVar4 = StringTokenizer::nextTokenAsInt(&SStack_10420);
          pRVar2->M = iVar4;
          StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10488,&SStack_10420);
          std::__cxx11::string::operator=((string *)&bStack_103a0,(string *)auStack_10488);
          if ((AtomType *)auStack_10488._0_8_ != (AtomType *)(auStack_10488 + 0x10)) {
            operator_delete((void *)auStack_10488._0_8_,auStack_10488._16_8_ + 1);
          }
          std::locale::locale((locale *)auStack_10488);
          toLower<std::__cxx11::string>(&bStack_103a0,(locale *)auStack_10488);
          std::locale::~locale((locale *)auStack_10488);
          iVar4 = std::__cxx11::string::compare((char *)&bStack_103a0);
          pRVar2 = pRStack_10490;
          pRStack_10490->functionType = (ushort)(iVar4 != 0);
          RVar1 = StringTokenizer::nextTokenAsDouble(&SStack_10420);
          pRVar2->coefficient = RVar1;
          if (vStack_10468.
              super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_10468.
              super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<OpenMD::RealSphericalHarmonic*,std::allocator<OpenMD::RealSphericalHarmonic*>>::
            _M_realloc_insert<OpenMD::RealSphericalHarmonic*const&>
                      ((vector<OpenMD::RealSphericalHarmonic*,std::allocator<OpenMD::RealSphericalHarmonic*>>
                        *)&vStack_10468,
                       (iterator)
                       vStack_10468.
                       super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&pRStack_10490);
          }
          else {
            *vStack_10468.
             super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = pRStack_10490;
            vStack_10468.
            super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_10468.
                 super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.delim_._M_dataplus._M_p != &SStack_10420.delim_.field_2) {
        operator_delete(SStack_10420.delim_._M_dataplus._M_p,
                        SStack_10420.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10420.tokenString_._M_dataplus._M_p != &SStack_10420.tokenString_.field_2) {
        operator_delete(SStack_10420.tokenString_._M_dataplus._M_p,
                        SStack_10420.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
    std::ios::widen((char)*(_func_int **)(auStack_102b0._0_8_ + -0x18) + (char)auStack_102b0);
    std::istream::getline(auStack_102b0,(long)abStack_10038,-1);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector(&vStack_10340,&vStack_10468);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  operator=(&pSStack_10428->strengthFuncs,&vStack_10340);
  if (vStack_10340.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_10340.
                    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_10340.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10340.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  __p = (SimpleTypeData<OpenMD::ShapeAtomType_*> *)operator_new(0x30);
  SStack_10420.tokenString_._M_dataplus._M_p = (pointer)&SStack_10420.tokenString_.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&SStack_10420,"Shape","");
  GenericData::GenericData((GenericData *)__p,&SStack_10420.tokenString_);
  (__p->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__GenericData_002ffa60;
  __p->data_ = pSStack_10428;
  sStack_10350.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::ShapeAtomType*>*>
            (&sStack_10350.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  AtomType::addProperty(pAStack_103c8,&sStack_10350);
  if (sStack_10350.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_10350.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_10420.tokenString_._M_dataplus._M_p != &SStack_10420.tokenString_.field_2) {
    operator_delete(SStack_10420.tokenString_._M_dataplus._M_p,
                    SStack_10420.tokenString_.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_10380 != &_Stack_10370) {
    operator_delete(p_Stack_10380,CONCAT71(_Stack_10370._1_7_,(undefined1)_Stack_10370._M_color) + 1
                   );
  }
  if (puStack_103c0 != &uStack_103b0) {
    operator_delete(puStack_103c0,CONCAT71(uStack_103af,uStack_103b0) + 1);
  }
  ifstrstream::~ifstrstream((ifstrstream *)auStack_102b0);
  if (vStack_10468.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (RealSphericalHarmonic **)0x0) {
    operator_delete(vStack_10468.
                    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_10468.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_10468.
                          super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_103a0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&bStack_103a0 + 0x10U)) {
    operator_delete(bStack_103a0._M_dataplus._M_p,
                    CONCAT71(bStack_103a0.field_2._M_allocated_capacity._1_7_,
                             bStack_103a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ShapeAtomTypesSectionParser::parseShapeFile(ForceField&,
                                                   std::string& shapeFileName,
                                                   AtomType* at) {
    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string token;

    Mat3x3d momInert;
    RealSphericalHarmonic* rsh;
    std::vector<RealSphericalHarmonic*> functionVector;
    ifstrstream shapeStream;
    std::string tempString;
    std::string ffPath;
    char* tempPath;

    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(ffPath, FRC_PATH);
    } else {
      ffPath = tempPath;
    }

    shapeStream.open(shapeFileName.c_str());

    if (!shapeStream.is_open()) {
      tempString = ffPath;
      tempString += "/";
      tempString += shapeFileName;
      shapeFileName = tempString;

      shapeStream.open(shapeFileName.c_str());

      if (!shapeStream.is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the shape file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 shapeFileName.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    ShapeAtomType* st = new ShapeAtomType();

    // first parse the info. in the ShapeInfo section
    findBegin(shapeStream, "ShapeInfo");
    shapeStream.getline(buffer, bufferSize);

    // loop over the interior of the ShapeInfo section
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo(buffer);
        // blank lines are ignored
        if (tokenInfo.countTokens() != 0) {
          if (tokenInfo.countTokens() < 5) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a ShapeInfo line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            tokenInfo.skipToken();
            at->setMass(tokenInfo.nextTokenAsDouble());
            DirectionalAdapter da = DirectionalAdapter(at);
            Mat3x3d I;
            I(0, 0) = tokenInfo.nextTokenAsDouble();
            I(1, 1) = tokenInfo.nextTokenAsDouble();
            I(2, 2) = tokenInfo.nextTokenAsDouble();
            da.makeDirectional(I);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // now grab the contact functions
    findBegin(shapeStream, "ContactFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo1(buffer);
        // blank lines are ignored
        if (tokenInfo1.countTokens() != 0) {
          if (tokenInfo1.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a ContactFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo1.nextTokenAsInt());
            rsh->setM(tokenInfo1.nextTokenAsInt());
            token = tokenInfo1.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo1.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass contact functions to ShapeType
    st->setContactFuncs(functionVector);

    // now grab the range functions
    findBegin(shapeStream, "RangeFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo2(buffer);
        // blank lines are ignored
        if (tokenInfo2.countTokens() != 0) {
          if (tokenInfo2.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a RangeFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo2.nextTokenAsInt());
            rsh->setM(tokenInfo2.nextTokenAsInt());
            token = tokenInfo2.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo2.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass range functions to ShapeType
    st->setRangeFuncs(functionVector);

    // finally grab the strength functions
    findBegin(shapeStream, "StrengthFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo3(buffer);
        // blank lines are ignored
        if (tokenInfo3.countTokens() != 0) {
          if (tokenInfo3.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a StrengthFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo3.nextTokenAsInt());
            rsh->setM(tokenInfo3.nextTokenAsInt());
            token = tokenInfo3.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo3.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass strength functions to ShapeType
    st->setStrengthFuncs(functionVector);
    at->addProperty(
        std::shared_ptr<GenericData>(new ShapeAtypeData("Shape", st)));
    //  delete shapeStream;
  }